

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O1

void FAPOBase_ProcessThru
               (FAPOBase *fapo,void *pInputBuffer,float *pOutputBuffer,uint32_t FrameCount,
               uint16_t InputChannelCount,uint16_t OutputChannelCount,uint8_t MixWithOutput)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  
  if (MixWithOutput == '\0') {
    if (FrameCount != 0) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        if (OutputChannelCount != 0) {
          uVar5 = 0;
          do {
            if (InputChannelCount != 0) {
              uVar4 = (ulong)InputChannelCount;
              uVar1 = uVar2;
              do {
                pOutputBuffer[uVar3 * OutputChannelCount + (int)uVar5] =
                     *(float *)((long)pInputBuffer + (ulong)uVar1 * 4);
                uVar1 = uVar1 + 1;
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != OutputChannelCount);
        }
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + InputChannelCount;
      } while (uVar3 != FrameCount);
    }
  }
  else if (FrameCount != 0) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      if (OutputChannelCount != 0) {
        uVar5 = 0;
        do {
          if (InputChannelCount != 0) {
            uVar6 = uVar3 * OutputChannelCount + (int)uVar5;
            fVar7 = pOutputBuffer[uVar6];
            uVar4 = (ulong)InputChannelCount;
            uVar1 = uVar2;
            do {
              fVar7 = fVar7 + *(float *)((long)pInputBuffer + (ulong)uVar1 * 4);
              pOutputBuffer[uVar6] = fVar7;
              uVar1 = uVar1 + 1;
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != OutputChannelCount);
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + InputChannelCount;
    } while (uVar3 != FrameCount);
  }
  return;
}

Assistant:

void FAPOBase_ProcessThru(
	FAPOBase *fapo,
	void* pInputBuffer,
	float *pOutputBuffer,
	uint32_t FrameCount,
	uint16_t InputChannelCount,
	uint16_t OutputChannelCount,
	uint8_t MixWithOutput
) {
	uint32_t i, co, ci;
	float *input = (float*) pInputBuffer;

	if (MixWithOutput)
	{
		/* TODO: SSE */
		for (i = 0; i < FrameCount; i += 1)
		for (co = 0; co < OutputChannelCount; co += 1)
		for (ci = 0; ci < InputChannelCount; ci += 1)
		{
			/* Add, don't overwrite! */
			pOutputBuffer[i * OutputChannelCount + co] +=
				input[i * InputChannelCount + ci];
		}
	}
	else
	{
		/* TODO: SSE */
		for (i = 0; i < FrameCount; i += 1)
		for (co = 0; co < OutputChannelCount; co += 1)
		for (ci = 0; ci < InputChannelCount; ci += 1)
		{
			/* Overwrite, don't add! */
			pOutputBuffer[i * OutputChannelCount + co] =
				input[i * InputChannelCount + ci];
		}
	}
}